

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ConditionalRenderInverted::FunctionalTest::FunctionalTest
          (FunctionalTest *this,Context *context)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"functional",
             "Conditional Render Inverted Functional Test");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01dcc9e0;
  this->m_fbo_id = 0;
  this->m_rbo_id = 0;
  this->m_vao_id = 0;
  this->m_po_id = 0;
  this->m_qo_id = 0;
  return;
}

Assistant:

gl4cts::ConditionalRenderInverted::FunctionalTest::FunctionalTest(deqp::Context& context)
	: deqp::TestCase(context, "functional", "Conditional Render Inverted Functional Test")
	, m_fbo_id(0)
	, m_rbo_id(0)
	, m_vao_id(0)
	, m_po_id(0)
	, m_qo_id(0)
{
	/* Intentionally left blank. */
}